

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_queue.c
# Opt level: O0

_Bool uo_cb_queue_init(void)

{
  int iVar1;
  _Bool local_9;
  
  if (is_init) {
    local_9 = true;
  }
  else {
    is_init = true;
    iVar1 = sem_init((sem_t *)&cb_queue,0,0);
    is_init = (is_init & 1U & iVar1 == 0) != 0;
    iVar1 = sem_init((sem_t *)&cb_queue.enqueue_sem,0,0x100);
    is_init = (is_init & 1U & iVar1 == 0) != 0;
    cb_queue.head = 0;
    cb_queue.tail = 0;
    atexit(uo_cb_queue_quit);
    local_9 = (_Bool)(is_init & 1);
  }
  return local_9;
}

Assistant:

bool uo_cb_queue_init()
{
    if (is_init)
        return true;

    is_init = true;

    is_init &= sem_init(&cb_queue.dequeue_sem, 0, 0) == 0;
    is_init &= sem_init(&cb_queue.enqueue_sem, 0, UO_CB_QUEUE_CAPACITY) == 0;

    atomic_init(&cb_queue.head, 0);
    atomic_init(&cb_queue.tail, 0);

    atexit(uo_cb_queue_quit);

    return is_init;
}